

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O3

void __thiscall
jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
write_bignum(basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,bigint *n
            )

{
  binary_stream_sink *this_00;
  undefined8 uVar1;
  bool bVar2;
  uint8_t *puVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  uint8_t buf [2];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  int signum;
  basic_bigint<std::allocator<unsigned_char>_> v;
  ulong local_80;
  basic_bigint<std::allocator<unsigned_char>_> local_78;
  int local_4c;
  basic_bigint<std::allocator<unsigned_char>_> local_48;
  
  bVar2 = operator<(n,0);
  if (bVar2) {
    basic_bigint<std::allocator<unsigned_char>_>::basic_bigint(&local_48,n);
    local_48.field_0._0_1_ = local_48.field_0._0_1_ ^ 2;
    jsoncons::operator-(&local_78,&local_48,1);
    basic_bigint<std::allocator<unsigned_char>_>::operator=(n,&local_78);
    if (((local_78.field_0._0_8_ & 1) != 0) &&
       ((pointer)local_78.field_0.short_stor_.values_[1] != (pointer)0x0)) {
      operator_delete(local_78.field_0.dynamic_stor_.data_,
                      local_78.field_0.short_stor_.values_[0] << 3);
    }
    if (((local_48.field_0._0_1_ & 1) != 0) &&
       ((pointer)local_48.field_0.short_stor_.values_[1] != (pointer)0x0)) {
      operator_delete(local_48.field_0.dynamic_stor_.data_,
                      local_48.field_0.short_stor_.values_[0] << 3);
    }
  }
  local_78._0_8_ = (uint8_t *)0x0;
  local_78.field_0._0_8_ = (uint8_t *)0x0;
  local_78.field_0.common_stor_.length_ = 0;
  basic_bigint<std::allocator<unsigned_char>>::write_bytes_be<std::allocator<unsigned_char>>
            ((basic_bigint<std::allocator<unsigned_char>> *)n,&local_4c,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78);
  uVar5 = local_78.field_0._0_8_ - local_78._0_8_;
  this_00 = &this->sink_;
  binary_stream_sink::push_back(this_00,bVar2 | 0xc2);
  if (uVar5 < 0x18) {
    uVar5 = (ulong)(byte)((byte)uVar5 | 0x40);
  }
  else {
    if (0xff < uVar5) {
      if (uVar5 < 0x10000) {
        binary_stream_sink::push_back(this_00,'Y');
        local_80 = CONCAT62(local_80._2_6_,(ushort)uVar5 << 8 | (ushort)uVar5 >> 8);
        lVar6 = 0;
        do {
          binary_stream_sink::push_back(this_00,*(uint8_t *)((long)&local_80 + lVar6));
          lVar6 = lVar6 + 1;
        } while (lVar6 != 2);
      }
      else if (uVar5 >> 0x20 == 0) {
        binary_stream_sink::push_back(this_00,'Z');
        uVar4 = (uint)uVar5;
        local_80 = CONCAT44(local_80._4_4_,
                            uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                            uVar4 << 0x18);
        lVar6 = 0;
        do {
          binary_stream_sink::push_back(this_00,*(uint8_t *)((long)&local_80 + lVar6));
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
      }
      else {
        binary_stream_sink::push_back(this_00,'[');
        local_80 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
                   (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
                   (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28
                   | uVar5 << 0x38;
        lVar6 = 0;
        do {
          binary_stream_sink::push_back(this_00,*(uint8_t *)((long)&local_80 + lVar6));
          lVar6 = lVar6 + 1;
        } while (lVar6 != 8);
      }
      goto LAB_0027a682;
    }
    binary_stream_sink::push_back(this_00,'X');
  }
  binary_stream_sink::push_back(this_00,(uint8_t)uVar5);
LAB_0027a682:
  uVar1 = local_78.field_0._0_8_;
  if (local_78._0_8_ != local_78.field_0._0_8_) {
    puVar3 = (uint8_t *)local_78._0_8_;
    do {
      binary_stream_sink::push_back(&this->sink_,*puVar3);
      puVar3 = puVar3 + 1;
    } while (puVar3 != (uint8_t *)uVar1);
  }
  if ((uint8_t *)local_78._0_8_ != (uint8_t *)0x0) {
    operator_delete((void *)local_78._0_8_,local_78.field_0.common_stor_.length_ - local_78._0_8_);
  }
  return;
}

Assistant:

void write_bignum(bigint& n)
    {
        bool is_neg = n < 0;
        if (is_neg)
        {
            n = - n -1;
        }

        int signum;
        std::vector<uint8_t> data;
        n.write_bytes_be(signum, data);
        std::size_t length = data.size();

        if (is_neg)
        {
            write_tag(3);
        }
        else
        {
            write_tag(2);
        }

        if (length <= 0x17)
        {
            // fixstr stores a byte array whose length is upto 31 bytes
            binary::native_to_big(static_cast<uint8_t>(0x40 + length), 
                                  std::back_inserter(sink_));
        }
        else if (length <= 0xff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x58), 
                                  std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint8_t>(length), 
                                  std::back_inserter(sink_));
        }
        else if (length <= 0xffff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x59), 
                                  std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint16_t>(length), 
                                  std::back_inserter(sink_));
        }
        else if (length <= 0xffffffff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x5a), 
                                  std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint32_t>(length), 
                                  std::back_inserter(sink_));
        }
        else if (uint64_t(length) <= (std::numeric_limits<std::uint64_t>::max)())
        {
            binary::native_to_big(static_cast<uint8_t>(0x5b), 
                                  std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint64_t>(length), 
                                  std::back_inserter(sink_));
        }

        for (auto c : data)
        {
            sink_.push_back(c);
        }
    }